

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightBounds * pbrt::Union(LightBounds *__return_storage_ptr__,LightBounds *a,LightBounds *b)

{
  Float FVar1;
  Float FVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar31;
  undefined8 uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  DirectionCone cone;
  DirectionCone local_70;
  DirectionCone local_58;
  DirectionCone local_40;
  
  if ((a->phi != 0.0) || (NAN(a->phi))) {
    if ((b->phi != 0.0) || (NAN(b->phi))) {
      uVar7._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar7._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar7;
      fVar16 = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18._0_4_ = (float)(undefined4)uVar7 * (float)(undefined4)uVar7;
      auVar18._4_4_ = (float)uVar7._4_4_ * (float)uVar7._4_4_;
      auVar18._8_8_ = 0;
      auVar18 = vhaddps_avx(auVar18,auVar18);
      FVar1 = a->cosTheta_o;
      fVar15 = fVar16 * fVar16 + auVar18._0_4_;
      if (fVar15 < 0.0) {
        local_70.w.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar15);
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        local_70.w.super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
      }
      auVar25._4_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar25._0_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar25._8_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar25._12_4_ = local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18 = vdivps_avx(auVar35,auVar25);
      local_70.w.super_Tuple3<pbrt::Vector3,_float>.z =
           fVar16 / local_70.w.super_Tuple3<pbrt::Vector3,_float>.z;
      local_70.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar18);
      local_70.empty = false;
      uVar8._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar8._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = uVar8;
      auVar19._0_4_ = (float)(undefined4)uVar8 * (float)(undefined4)uVar8;
      auVar19._4_4_ = (float)uVar8._4_4_ * (float)uVar8._4_4_;
      auVar19._8_8_ = 0;
      auVar18 = vhaddps_avx(auVar19,auVar19);
      fVar16 = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
      FVar2 = b->cosTheta_o;
      fVar15 = fVar16 * fVar16 + auVar18._0_4_;
      local_70.cosTheta = FVar1;
      if (fVar15 < 0.0) {
        local_40.w.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(fVar15);
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
        local_40.w.super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
      }
      auVar26._4_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._0_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._8_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar26._12_4_ = local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar18 = vdivps_avx(auVar36,auVar26);
      local_40.w.super_Tuple3<pbrt::Vector3,_float>.z =
           fVar16 / local_40.w.super_Tuple3<pbrt::Vector3,_float>.z;
      local_40.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar18);
      local_40.empty = false;
      local_40.cosTheta = FVar2;
      Union(&local_58,&local_70,&local_40);
      auVar25 = vminss_avx(ZEXT416((uint)b->cosTheta_e),ZEXT416((uint)a->cosTheta_e));
      uVar3 = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar9 = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar20._4_4_ = uVar9;
      auVar20._0_4_ = uVar3;
      auVar20._8_8_ = 0;
      uVar4 = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar10 = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
      auVar27._4_4_ = uVar10;
      auVar27._0_4_ = uVar4;
      auVar27._8_8_ = 0;
      auVar19 = vminps_avx(auVar20,auVar27);
      uVar5 = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar11 = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar28._4_4_ = uVar11;
      auVar28._0_4_ = uVar5;
      auVar28._8_8_ = 0;
      auVar36 = vminss_avx(ZEXT416((uint)(b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z));
      uVar6 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x;
      uVar12 = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
      auVar37._4_4_ = uVar12;
      auVar37._0_4_ = uVar6;
      auVar37._8_8_ = 0;
      auVar18 = vmaxps_avx(auVar37,auVar28);
      auVar35 = vmaxss_avx(ZEXT416((uint)(b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z),
                           ZEXT416((uint)(a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z));
      fVar16 = a->phi;
      fVar15 = b->phi;
      bVar13 = b->twoSided;
      bVar14 = a->twoSided;
      uVar17 = vmovlps_avx(auVar19);
      (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17
      ;
      (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = auVar36._0_4_;
      uVar17 = vmovlps_avx(auVar18);
      (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17
      ;
      (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = auVar35._0_4_;
      __return_storage_ptr__->phi = fVar16 + fVar15;
      auVar29._0_4_ =
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.y *
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar29._4_4_ =
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.z *
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._8_8_ = 0;
      auVar18 = vmovshdup_avx(auVar29);
      fVar16 = local_58.w.super_Tuple3<pbrt::Vector3,_float>.x *
               local_58.w.super_Tuple3<pbrt::Vector3,_float>.x + auVar29._0_4_ + auVar18._0_4_;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
        fVar16 = auVar18._0_4_;
      }
      auVar30._4_4_ = local_58.w.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar30._0_4_ = local_58.w.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar30._8_8_ = 0;
      auVar34._4_4_ = fVar16;
      auVar34._0_4_ = fVar16;
      auVar34._8_4_ = fVar16;
      auVar34._12_4_ = fVar16;
      auVar18 = vdivps_avx(auVar30,auVar34);
      uVar17 = vmovlps_avx(auVar18);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar17;
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar17 >> 0x20);
      (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z =
           local_58.w.super_Tuple3<pbrt::Vector3,_float>.z / fVar16;
      __return_storage_ptr__->cosTheta_o = local_58.cosTheta;
      __return_storage_ptr__->cosTheta_e = auVar25._0_4_;
      __return_storage_ptr__->twoSided = (bool)(bVar13 | bVar14);
      return __return_storage_ptr__;
    }
    uVar17._0_4_ = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar17._4_4_ = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar21 = *(undefined8 *)&(a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar22._0_4_ = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar22._4_4_ = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar23._0_4_ = a->phi;
    uVar23._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar24 = *(undefined8 *)&(a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar31._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar31._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar32 = *(undefined8 *)&(a->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar33._0_4_ = a->cosTheta_e;
    uVar33._4_1_ = a->twoSided;
    uVar33._5_3_ = *(undefined3 *)&a->field_0x31;
  }
  else {
    uVar17._0_4_ = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar17._4_4_ = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar21 = *(undefined8 *)&(b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar22._0_4_ = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar22._4_4_ = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar23._0_4_ = b->phi;
    uVar23._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar24 = *(undefined8 *)&(b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar31._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar31._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar32 = *(undefined8 *)&(b->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar33._0_4_ = b->cosTheta_e;
    uVar33._4_1_ = b->twoSided;
    uVar33._5_3_ = *(undefined3 *)&b->field_0x31;
  }
  *(undefined8 *)&(__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar24
  ;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar31;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar31 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = uVar32;
  __return_storage_ptr__->cosTheta_e = (Float)(int)uVar33;
  __return_storage_ptr__->twoSided = (bool)(char)((ulong)uVar33 >> 0x20);
  *(int3 *)&__return_storage_ptr__->field_0x31 = (int3)((ulong)uVar33 >> 0x28);
  (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar17;
  (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar17 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar21
  ;
  (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar22;
  (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar22 >> 0x20);
  __return_storage_ptr__->phi = (Float)(int)uVar23;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)uVar23 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    // If one _LightBounds_ has zero power, return the other
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;

    // Find average direction and updated angles for _LightBounds_
    DirectionCone cone =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float cosTheta_o = cone.cosTheta;
    Float cosTheta_e = std::min(a.cosTheta_e, b.cosTheta_e);

    // Return final _LightBounds_ union
    return LightBounds(Union(a.bounds, b.bounds), cone.w, a.phi + b.phi, cosTheta_o,
                       cosTheta_e, a.twoSided | b.twoSided);
}